

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

stsentry * Curl_hsts(hsts *h,char *hostname,_Bool subdomain)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  Curl_llist_node *n;
  stsentry *e;
  long lVar3;
  ulong uVar4;
  stsentry *psVar5;
  byte bVar6;
  bool bVar7;
  char buffer [257];
  undefined8 local_140;
  char local_138 [264];
  
  if (h != (hsts *)0x0) {
    bVar7 = false;
    local_140 = time((time_t *)0x0);
    sVar2 = strlen(hostname);
    psVar5 = (stsentry *)0x0;
    if (sVar2 - 1 < 0x100) {
      memcpy(local_138,hostname,sVar2);
      uVar4 = sVar2 - 1;
      if (hostname[sVar2 - 1] != '.') {
        uVar4 = sVar2;
      }
      local_138[uVar4] = '\0';
      n = Curl_llist_head(&h->list);
      if (n == (Curl_llist_node *)0x0) {
        bVar7 = true;
      }
      else {
        do {
          e = (stsentry *)Curl_node_elem(n);
          n = Curl_node_next(n);
          if (local_140 < e->expires) {
            if ((subdomain) && (e->includeSubDomains == true)) {
              __s = e->host;
              sVar2 = strlen(__s);
              bVar7 = true;
              lVar3 = uVar4 - sVar2;
              if ((sVar2 <= uVar4 && lVar3 != 0) &&
                 ((local_138[lVar3 + -1] == '.' &&
                  (iVar1 = curl_strnequal(local_138 + lVar3,__s,sVar2), iVar1 != 0)))) {
                bVar7 = false;
                psVar5 = e;
              }
              bVar6 = 1;
              if (!bVar7) goto LAB_001326f8;
            }
            iVar1 = curl_strequal(local_138,e->host);
            bVar6 = iVar1 != 0;
            if ((bool)bVar6) {
              psVar5 = e;
            }
          }
          else {
            Curl_node_remove((Curl_llist_node *)e);
            (*Curl_cfree)(e->host);
            (*Curl_cfree)(e);
            bVar6 = 4;
          }
LAB_001326f8:
          if ((bVar6 & 3) != 0) goto LAB_00132708;
        } while (n != (Curl_llist_node *)0x0);
        bVar6 = 0;
LAB_00132708:
        bVar7 = bVar6 == 0;
      }
    }
    if (!bVar7) {
      return psVar5;
    }
  }
  return (stsentry *)0x0;
}

Assistant:

struct stsentry *Curl_hsts(struct hsts *h, const char *hostname,
                           bool subdomain)
{
  if(h) {
    char buffer[MAX_HSTS_HOSTLEN + 1];
    time_t now = time(NULL);
    size_t hlen = strlen(hostname);
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;

    if((hlen > MAX_HSTS_HOSTLEN) || !hlen)
      return NULL;
    memcpy(buffer, hostname, hlen);
    if(hostname[hlen-1] == '.')
      /* remove the trailing dot */
      --hlen;
    buffer[hlen] = 0;
    hostname = buffer;

    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      n = Curl_node_next(e);
      if(sts->expires <= now) {
        /* remove expired entries */
        Curl_node_remove(&sts->node);
        hsts_free(sts);
        continue;
      }
      if(subdomain && sts->includeSubDomains) {
        size_t ntail = strlen(sts->host);
        if(ntail < hlen) {
          size_t offs = hlen - ntail;
          if((hostname[offs-1] == '.') &&
             strncasecompare(&hostname[offs], sts->host, ntail))
            return sts;
        }
      }
      if(strcasecompare(hostname, sts->host))
        return sts;
    }
  }
  return NULL; /* no match */
}